

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corona_loader.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::CoronaLoader::loadMaterialLibrary(CoronaLoader *this,FileName *fileName)

{
  Ref<embree::XML> *pRVar1;
  bool bVar2;
  runtime_error *this_00;
  FileName *in_RDX;
  Ref<embree::XML> *child;
  Ref<embree::XML> *xml_00;
  Ref<embree::XML> xml;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  FileName::operator+((FileName *)&local_90,fileName,in_RDX);
  std::__cxx11::string::string((string *)&local_50,"/.-",(allocator *)&local_70);
  parseXML((embree *)&xml,(FileName *)&local_90,&local_50,false);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_90);
  bVar2 = std::operator!=(&(xml.ptr)->name,"mtlLib");
  if (!bVar2) {
    pRVar1 = ((xml.ptr)->children).
             super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (xml_00 = ((xml.ptr)->children).
                  super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; xml_00 != pRVar1; xml_00 = xml_00 + 1)
    {
      bVar2 = std::operator==(&xml_00->ptr->name,"materialDefinition");
      if (bVar2) {
        loadMaterialDefinition((CoronaLoader *)fileName,xml_00);
      }
      else {
        bVar2 = std::operator==(&xml_00->ptr->name,"mapDefinition");
        if (bVar2) {
          loadMapDefinition((CoronaLoader *)fileName,xml_00);
        }
      }
    }
    (this->path).filename._M_dataplus._M_p = (pointer)0x0;
    if (xml.ptr != (XML *)0x0) {
      (*((xml.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
    return (Ref<embree::SceneGraph::Node>)(Node *)this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ParseLocation::str_abi_cxx11_(&local_70,&(xml.ptr)->loc);
  std::operator+(&local_90,&local_70,": invalid material library");
  std::runtime_error::runtime_error(this_00,(string *)&local_90);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Ref<SceneGraph::Node> CoronaLoader::loadMaterialLibrary(const FileName& fileName) 
  {
    Ref<XML> xml = parseXML(path+fileName,"/.-",false);
    if (xml->name != "mtlLib") 
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid material library");
    
    for (auto& child : xml->children)
    {
      if (child->name == "materialDefinition") {
        loadMaterialDefinition(child);
      }
      else if (child->name == "mapDefinition")
        loadMapDefinition(child);
    }

    return nullptr;
  }